

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

int coda_random_init(void)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  uint32_t rnd_from_device;
  uint local_c;
  
  if (coda_random_inited != 0) {
    return 0;
  }
  __fd = open64("/dev/urandom",0);
  if (__fd < 0) {
    iVar1 = -1;
  }
  else {
    sVar2 = read(__fd,&local_c,4);
    iVar1 = -1;
    if (-1 < (int)sVar2) {
      close(__fd);
      srandom(local_c);
      coda_random_inited = 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int coda_random_init()
{
	if (coda_random_inited)
	{
		return 0;
	}

	int fd = open("/dev/urandom", O_RDONLY);
	if (0 > fd) return -1;

	uint32_t rnd_from_device;

	int rc = read(fd, &rnd_from_device, sizeof(rnd_from_device));
	if (0 > rc) return -1;

	close(fd);

	srandom(rnd_from_device);
	coda_random_inited = 1;

	return 0;
}